

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# naive_vector_column.h
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
Gudhi::persistence_matrix::
Naive_vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>
::get_content(vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
             Naive_vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>
             *this,int columnLength)

{
  uint uVar1;
  bool bVar2;
  ID_index IVar3;
  size_type sVar4;
  const_reference ppEVar5;
  reference ppEVar6;
  uint *puVar7;
  reference pvVar8;
  bool bVar9;
  __normal_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*const_*,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>
  local_48;
  __normal_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*const_*,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>
  local_40;
  const_iterator it;
  allocator<unsigned_int> local_25;
  value_type_conflict1 local_24;
  undefined1 local_1d;
  uint local_1c;
  Naive_vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>
  *pNStack_18;
  int columnLength_local;
  Naive_vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>
  *this_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *container;
  
  local_1c = columnLength;
  pNStack_18 = this;
  this_local = (Naive_vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>
                *)__return_storage_ptr__;
  if ((columnLength < 0) &&
     (sVar4 = std::
              vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
              ::size(&this->column_), sVar4 != 0)) {
    ppEVar5 = std::
              vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
              ::back(&this->column_);
    IVar3 = Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>
            ::get_row_index(*ppEVar5);
    local_1c = IVar3 + 1;
  }
  else if ((int)local_1c < 0) {
    memset(__return_storage_ptr__,0,0x18);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  local_1d = 0;
  sVar4 = (size_type)(int)local_1c;
  local_24 = 0;
  std::allocator<unsigned_int>::allocator(&local_25);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (__return_storage_ptr__,sVar4,&local_24,&local_25);
  std::allocator<unsigned_int>::~allocator(&local_25);
  local_40._M_current =
       (Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>
        **)std::
           vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
           ::begin(&this->column_);
  while( true ) {
    local_48._M_current =
         (Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>
          **)std::
             vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
             ::end(&this->column_);
    bVar2 = __gnu_cxx::operator!=(&local_40,&local_48);
    bVar9 = false;
    if (bVar2) {
      ppEVar6 = __gnu_cxx::
                __normal_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*const_*,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>
                ::operator*(&local_40);
      IVar3 = Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>
              ::get_row_index(*ppEVar6);
      bVar9 = IVar3 < local_1c;
    }
    if (!bVar9) break;
    ppEVar6 = __gnu_cxx::
              __normal_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*const_*,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>
              ::operator*(&local_40);
    puVar7 = Entry_field_element<unsigned_int>::get_element
                       (&(*ppEVar6)->super_Entry_field_element_option);
    uVar1 = *puVar7;
    ppEVar6 = __gnu_cxx::
              __normal_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*const_*,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>
              ::operator*(&local_40);
    IVar3 = Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>
            ::get_row_index(*ppEVar6);
    pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (__return_storage_ptr__,(ulong)IVar3);
    *pvVar8 = uVar1;
    __gnu_cxx::
    __normal_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*const_*,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>
    ::operator++(&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<typename Naive_vector_column<Master_matrix,Support>::Field_element>
Naive_vector_column<Master_matrix,Support>::get_content(int columnLength) const
{
  if (columnLength < 0 && column_.size() > 0)
    columnLength = column_.back()->get_row_index() + 1;
  else if (columnLength < 0)
    return std::vector<Field_element>();

  std::vector<Field_element> container(columnLength, 0);
  for (auto it = column_.begin(); it != column_.end() && (*it)->get_row_index() < static_cast<ID_index>(columnLength);
       ++it) {
    if constexpr (Master_matrix::Option_list::is_z2) {
      container[(*it)->get_row_index()] = 1;
    } else {
      container[(*it)->get_row_index()] = (*it)->get_element();
    }
  }
  return container;
}